

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall
wallet::WalletBatch::EraseActiveScriptPubKeyMan(WalletBatch *this,uint8_t type,bool internal)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined7 in_register_00000011;
  long *plVar3;
  long in_FS_OFFSET;
  bool bVar4;
  string key;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  local_78;
  long *local_50;
  long local_48;
  long local_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = &DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_;
  plVar3 = &DAT_00b4c9b8;
  bVar4 = (int)CONCAT71(in_register_00000011,internal) != 0;
  if (bVar4) {
    plVar2 = &DBKeys::ACTIVEINTERNALSPK_abi_cxx11_;
  }
  if (bVar4) {
    plVar3 = &DAT_00b4c9d8;
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,*plVar2,*plVar3 + *plVar2);
  paVar1 = &local_78.first.field_2;
  local_78.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_50,local_48 + (long)local_50);
  local_78.second = type;
  bVar4 = EraseIC<std::pair<std::__cxx11::string,unsigned_char>>(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.first._M_dataplus._M_p,local_78.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseActiveScriptPubKeyMan(uint8_t type, bool internal)
{
    const std::string key{internal ? DBKeys::ACTIVEINTERNALSPK : DBKeys::ACTIVEEXTERNALSPK};
    return EraseIC(make_pair(key, type));
}